

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

void __thiscall crnlib::dynamic_string::optimize(dynamic_string *this)

{
  uint uVar1;
  ushort uVar2;
  char *pcVar3;
  void *pvVar4;
  uint uVar5;
  
  uVar2 = this->m_len;
  if (uVar2 != 0) {
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar5 = (uint)(ushort)(uVar2 >> 1 | uVar2);
    uVar1 = uVar5 + 1;
    if (uVar1 < this->m_buf_size) {
      pvVar4 = crnlib_malloc((ulong)(uVar5 + 0x11));
      *(uint *)((long)pvVar4 + 0xc) = uVar1;
      *(uint *)((long)pvVar4 + 8) = -2 - uVar5;
      memcpy((char *)((long)pvVar4 + 0x10),this->m_pStr,(ulong)this->m_len + 1);
      pcVar3 = this->m_pStr;
      if ((pcVar3 != (char *)0x0) &&
         ((*(uint *)(pcVar3 + -8) ^ *(uint *)(pcVar3 + -4)) == 0xffffffff)) {
        crnlib_free(pcVar3 + -0x10);
      }
      this->m_pStr = (char *)((long)pvVar4 + 0x10);
      this->m_buf_size = (uint16)uVar1;
    }
    return;
  }
  clear(this);
  return;
}

Assistant:

void dynamic_string::optimize()
    {
        if (!m_len)
        {
            clear();
        }
        else
        {
            uint min_buf_size = math::next_pow2((uint)m_len + 1);
            if (m_buf_size > min_buf_size)
            {
                char* p = crnlib_new_array<char>(min_buf_size);
                memcpy(p, m_pStr, m_len + 1);

                crnlib_delete_array(m_pStr);
                m_pStr = p;

                m_buf_size = static_cast<uint16>(min_buf_size);

                check();
            }
        }
    }